

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O0

int th06_compile(thecl_t *ecl,FILE *out)

{
  thecl_sub_t *sub_00;
  int iVar1;
  size_t __nmemb;
  long lVar2;
  long lVar3;
  th06_timeline_instr_t *buffer;
  char *local_120;
  th06_timeline_instr_t *raw_instr_1;
  list_node_t *node_4;
  thecl_instr_t *instr_1;
  list_node_t *node_3;
  thecl_sub_t *timeline;
  size_t o;
  char timeline_sentinel_th8 [8];
  char timeline_sentinel_th6 [4];
  th06_instr_t *raw_instr;
  list_node_t *node_2;
  thecl_instr_t *instr;
  list_node_t *node_1;
  size_t s;
  uint16_t max_opcode;
  thecl_sub_t *sub;
  size_t offset_count;
  size_t timeline_count;
  list_node_t *node;
  thecl_timeline_t *iter_timeline;
  th06_instr_t sentinel;
  uint32_t *offsets;
  long lStack_30;
  th06_header_t header;
  size_t header_size;
  FILE *pFStack_20;
  uint32_t magic;
  FILE *out_local;
  thecl_t *ecl_local;
  
  header_size._4_4_ = 0x800;
  if (ecl->version == 9) {
    header_size._4_4_ = 0x900;
  }
  lStack_30 = 0;
  if (7 < ecl->version) {
    lStack_30 = 4;
  }
  lStack_30 = lStack_30 + 4;
  offsets._4_2_ = (undefined2)ecl->sub_count;
  offsets._6_2_ = 0;
  stack0xffffffffffffffb4 = 0xcffffffffffff;
  sentinel.time = 0xffff00;
  for (timeline_count = (size_t)(ecl->timelines).head; timeline_count != 0;
      timeline_count = *(size_t *)timeline_count) {
    offsets._6_2_ = offsets._6_2_ + 1;
  }
  if (ecl->version == 9) {
    offset_count = (size_t)offsets._6_2_;
  }
  else if (ecl->version == 6) {
    offset_count = 3;
    offsets._6_2_ = 0;
  }
  else {
    offset_count = 0x10;
  }
  __nmemb = offset_count + (ecl->sub_count & 0xffff);
  pFStack_20 = out;
  out_local = (FILE *)ecl;
  iVar1 = file_seekable(out);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s: output is not seekable\n",argv0);
    ecl_local._4_4_ = 0;
  }
  else {
    file_seek(pFStack_20,lStack_30 + __nmemb * 4);
    sentinel._4_8_ = calloc(__nmemb,4);
    if (out_local->_flags == 6) {
      s._6_2_ = 0x87;
    }
    else {
      s._6_2_ = 0xffff;
    }
    node_1 = (list_node_t *)0x0;
    for (instr = (thecl_instr_t *)out_local->_IO_write_end; instr != (thecl_instr_t *)0x0;
        instr = *(thecl_instr_t **)instr) {
      sub_00 = *(thecl_sub_t **)&instr->id;
      lVar2 = file_tell(pFStack_20);
      *(int *)(sentinel._4_8_ + ((long)&node_1->next + offset_count) * 4) = (int)lVar2;
      for (raw_instr = (th06_instr_t *)(sub_00->instrs).head; raw_instr != (th06_instr_t *)0x0;
          raw_instr = *(th06_instr_t **)raw_instr) {
        register0x00000000 =
             th06_instr_serialize((thecl_t *)out_local,sub_00,*(thecl_instr_t **)&raw_instr[1].id);
        file_write(pFStack_20,register0x00000000,(ulong)register0x00000000->size);
        if (s._6_2_ < stack0xffffffffffffff58->id) {
          fprintf(_stderr,"%s: warning: opcode: id %hu was higher than the maximum %hu\n",argv0,
                  (ulong)stack0xffffffffffffff58->id,(ulong)s._6_2_);
        }
        free(stack0xffffffffffffff58);
      }
      file_write(pFStack_20,(void *)((long)&iter_timeline + 4),0xc);
      node_1 = (list_node_t *)((long)&node_1->next + 1);
    }
    timeline_sentinel_th8[0] = -1;
    timeline_sentinel_th8[1] = -1;
    timeline_sentinel_th8[2] = '\x04';
    timeline_sentinel_th8[3] = '\0';
    stack0xffffffffffffff4c = 0xffffffff;
    timeline = (thecl_sub_t *)0x0;
    for (instr_1 = (thecl_instr_t *)out_local->_IO_buf_end; instr_1 != (thecl_instr_t *)0x0;
        instr_1 = *(thecl_instr_t **)instr_1) {
      lVar2 = *(long *)&instr_1->id;
      lVar3 = file_tell(pFStack_20);
      *(int *)(sentinel._4_8_ + (long)timeline * 4) = (int)lVar3;
      for (raw_instr_1 = *(th06_timeline_instr_t **)(lVar2 + 0x38);
          raw_instr_1 != (th06_timeline_instr_t *)0x0;
          raw_instr_1 = *(th06_timeline_instr_t **)raw_instr_1) {
        buffer = th06_timeline_instr_serialize((thecl_t *)out_local,(thecl_instr_t *)raw_instr_1[2])
        ;
        file_write(pFStack_20,buffer,(ulong)buffer->size);
        free(buffer);
      }
      if ((uint)out_local->_flags < 8) {
        local_120 = timeline_sentinel_th8;
      }
      else {
        local_120 = (char *)((long)&o + 4);
      }
      iVar1 = 8;
      if ((uint)out_local->_flags < 8) {
        iVar1 = 4;
      }
      file_write(pFStack_20,local_120,(long)iVar1);
      timeline = (thecl_sub_t *)((long)&timeline->name + 1);
    }
    if ((out_local->_flags != 9) && (out_local->_flags != 6)) {
      lVar2 = file_tell(pFStack_20);
      *(int *)(sentinel._4_8_ + (long)timeline * 4) = (int)lVar2;
    }
    file_seek(pFStack_20,0);
    if (7 < (uint)out_local->_flags) {
      file_write(pFStack_20,(void *)((long)&header_size + 4),4);
    }
    file_write(pFStack_20,(void *)((long)&offsets + 4),4);
    file_write(pFStack_20,(void *)sentinel._4_8_,__nmemb * 4);
    free((void *)sentinel._4_8_);
    ecl_local._4_4_ = 1;
  }
  return ecl_local._4_4_;
}

Assistant:

static int
th06_compile(
    const thecl_t* ecl,
    FILE* out)
{
    const uint32_t magic = ecl->version == 9 ? 0x00000900 : 0x00000800;
    const size_t header_size = sizeof(th06_header_t) + ((ecl->version >= 8) ? sizeof(uint32_t) : 0);

    th06_header_t header = {
        .sub_count = ecl->sub_count
    };
    uint32_t* offsets;
    const th06_instr_t sentinel = {
        .time = 0xffffffff,
        .id = 0xffff,
        .size = sizeof(sentinel),
        .rank_mask = 0xff00,
        .param_mask = 0x00ff
    };

    thecl_timeline_t* iter_timeline;
    list_for_each(&ecl->timelines, iter_timeline)
        ++header.timeline_count;

    size_t timeline_count;
    if (ecl->version == 9)
        timeline_count = header.timeline_count;
    else if (ecl->version == 6) {
        timeline_count = 3;
        header.timeline_count = 0;
    } else
        timeline_count = 16;
    const size_t offset_count = timeline_count + header.sub_count;

    if (!file_seekable(out)) {
        fprintf(stderr, "%s: output is not seekable\n", argv0);
        return 0;
    }

    file_seek(out, header_size + offset_count * sizeof(uint32_t));

    offsets = calloc(offset_count, sizeof(*offsets));

    thecl_sub_t* sub;
    uint16_t max_opcode;
    /* TODO: Get max opcodes for the rest of the games */
    switch (ecl->version)
    {
    case 6:
        max_opcode = 135;
        break;
    default:
        max_opcode = 0xFFFFU;
        break;
    }
    size_t s = 0;
    list_for_each(&ecl->subs, sub) {
        offsets[timeline_count + s] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&sub->instrs, instr) {
            th06_instr_t* raw_instr = th06_instr_serialize(ecl, sub, instr);
            file_write(out, raw_instr, raw_instr->size);
            if (raw_instr->id > max_opcode) {
                fprintf(stderr, "%s: warning: opcode: id %hu was higher than the maximum %hu\n", argv0, raw_instr->id, max_opcode);
            }
            free(raw_instr);
        }

        file_write(out, &sentinel, sizeof(sentinel));

        ++s;
    }

    char timeline_sentinel_th6[4] = {0xff, 0xff, 0x04, 0x00};
    char timeline_sentinel_th8[8] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00, 0x00, 0x00};

    size_t o = 0;
    thecl_sub_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        offsets[o++] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&timeline->instrs, instr) {
            th06_timeline_instr_t* raw_instr = th06_timeline_instr_serialize(ecl, instr);

            file_write(out, raw_instr, raw_instr->size);
            free(raw_instr);
        }

        file_write(out, ecl->version < 8 ? timeline_sentinel_th6 : timeline_sentinel_th8, ecl->version < 8 ? 4 : 8);
    }

    if (ecl->version != 9 && ecl->version != 6)
        offsets[o] = file_tell(out);

    file_seek(out, 0);
    if (ecl->version >= 8)
        file_write(out, &magic, sizeof(magic));
    file_write(out, &header, sizeof(header));
    file_write(out, offsets, offset_count * sizeof(*offsets));
    free(offsets);

    return 1;
}